

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O1

void __thiscall
HighsSparseMatrix::priceByRowWithSwitch
          (HighsSparseMatrix *this,bool quad_precision,HVector *result,HVector *column,
          double expected_density,HighsInt from_index,double switch_density,HighsInt debug_report)

{
  int *piVar1;
  double dVar2;
  double dVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer piVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  uint uVar11;
  int iVar12;
  int *piVar13;
  ulong uVar14;
  double *pdVar15;
  long lVar16;
  undefined7 in_register_00000031;
  int iVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  double dVar21;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> result_array;
  HighsSparseVectorSum local_98;
  vector<double,_std::allocator<double>_> *local_60;
  double local_58;
  double local_50;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> local_48;
  
  uVar14 = (ulong)(uint)from_index;
  local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50 = switch_density;
  if ((int)CONCAT71(in_register_00000031,quad_precision) != 0) {
    iVar17 = this->num_col_;
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize(&local_98.values,(long)iVar17);
    std::vector<int,_std::allocator<int>_>::reserve(&local_98.nonzeroinds,(long)iVar17);
  }
  if (-2 < debug_report) {
    puts("\nHighsSparseMatrix::priceByRowWithSwitch");
  }
  iVar17 = (int)uVar14;
  if ((expected_density <= 0.1) && (from_index < column->count)) {
    dVar21 = 1.0 / (double)this->num_col_;
    local_60 = &result->array;
    lVar16 = (long)from_index;
    local_58 = dVar21;
    do {
      dVar10 = local_50;
      iVar17 = (column->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar16];
      piVar1 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + (long)iVar17 + 1;
      piVar13 = (this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + iVar17;
      if (this->format_ != kRowwisePartitioned) {
        piVar13 = piVar1;
      }
      iVar19 = *piVar13;
      dVar9 = (double)result->count * dVar21;
      bVar8 = (iVar19 - piVar1[-1]) + result->count < this->num_col_;
      if (dVar9 <= local_50 && bVar8) {
        dVar21 = (column->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar17];
        if ((debug_report == -1) || (iVar17 == debug_report)) {
          debugReportRowPrice(this,iVar17,dVar21,iVar19,local_60);
        }
        if ((dVar21 != 0.0) || (NAN(dVar21))) {
          iVar17 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar17];
          lVar18 = (long)iVar17;
          if (quad_precision) {
            if (iVar17 < iVar19) {
              iVar19 = iVar19 - iVar17;
              do {
                HighsSparseVectorSum::add
                          (&local_98,
                           (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar18],
                           (this->value_).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar18] * dVar21);
                lVar18 = lVar18 + 1;
                iVar19 = iVar19 + -1;
              } while (iVar19 != 0);
            }
          }
          else if (iVar17 < iVar19) {
            piVar5 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar6 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar7 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar4 = (result->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            do {
              uVar11 = piVar5[lVar18];
              uVar14 = (ulong)uVar11;
              dVar2 = pdVar4[(int)uVar11];
              dVar3 = pdVar6[lVar18];
              if ((dVar2 == 0.0) && (!NAN(dVar2))) {
                iVar17 = result->count;
                result->count = iVar17 + 1;
                piVar7[iVar17] = uVar11;
              }
              dVar2 = dVar3 * dVar21 + dVar2;
              uVar20 = -(ulong)(ABS(dVar2) < 1e-14);
              pdVar4[(int)uVar11] = (double)(~uVar20 & (ulong)dVar2 | uVar20 & 0x358dee7a4ad4b81f);
              lVar18 = lVar18 + 1;
            } while (iVar19 != lVar18);
          }
        }
        from_index = (int)lVar16 + 1;
        dVar21 = local_58;
      }
      iVar17 = (int)uVar14;
    } while ((dVar9 <= dVar10 && bVar8) && (lVar16 = lVar16 + 1, lVar16 < column->count));
  }
  if (quad_precision) {
    uVar14 = (ulong)((long)local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start) >> 2;
    uVar11 = (uint)uVar14;
    if (0 < (int)uVar11) {
      lVar16 = (ulong)(uVar11 & 0x7fffffff) + 1;
      do {
        iVar17 = local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar16 + -2];
        if (ABS(local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar17].hi +
                local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar17].lo) <= 1e-14) {
          iVar12 = (int)uVar14;
          uVar14 = (ulong)(iVar12 - 1);
          local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
          super__Vector_impl_data._M_start[iVar17].hi = 0.0;
          local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
          super__Vector_impl_data._M_start[iVar17].lo = 0.0;
          iVar19 = local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)iVar12 + -1];
          local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[(long)iVar12 + -1] = iVar17;
          local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar16 + -2] = iVar19;
        }
        uVar11 = (uint)uVar14;
        lVar16 = lVar16 + -1;
      } while (1 < lVar16);
    }
    std::vector<int,_std::allocator<int>_>::resize(&local_98.nonzeroinds,(long)(int)uVar11);
  }
  if (from_index < column->count) {
    if (quad_precision) {
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::vector(&local_48,&local_98.values);
      priceByRowDenseResult(this,&local_48,column,from_index,iVar17);
      result->count = 0;
      if (0 < this->num_col_) {
        piVar5 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (result->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar15 = &(local_48.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
                    .super__Vector_impl_data._M_start)->lo;
        lVar16 = 0;
        do {
          dVar21 = ((HighsCDouble *)(pdVar15 + -1))->hi + *pdVar15;
          if (1e-14 <= ABS(dVar21)) {
            pdVar6[lVar16] = dVar21;
            iVar17 = result->count;
            result->count = iVar17 + 1;
            piVar5[iVar17] = (int)lVar16;
          }
          else {
            pdVar6[lVar16] = 0.0;
          }
          lVar16 = lVar16 + 1;
          pdVar15 = pdVar15 + 2;
        } while (lVar16 < this->num_col_);
      }
      if (local_48.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      priceByRowDenseResult(this,&result->array,column,from_index,-2);
      result->count = 0;
      if (0 < this->num_col_) {
        piVar5 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (result->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar16 = 0;
        do {
          if (1e-14 <= ABS(pdVar6[lVar16])) {
            iVar17 = result->count;
            result->count = iVar17 + 1;
            piVar5[iVar17] = (int)lVar16;
          }
          else {
            pdVar6[lVar16] = 0.0;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < this->num_col_);
      }
    }
  }
  else if (quad_precision) {
    piVar5 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (piVar5 != (pointer)0x0) {
      operator_delete(piVar5);
    }
    piVar5 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar7 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::vector<int,_std::allocator<int>_>::resize(&result->index,(long)this->num_col_);
    uVar11 = (uint)((ulong)((long)piVar5 - (long)piVar7) >> 2);
    result->count = uVar11;
    if (0 < (int)uVar11) {
      piVar5 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (result->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar14 = 0;
      do {
        iVar17 = piVar5[uVar14];
        pdVar6[iVar17] =
             local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
             .super__Vector_impl_data._M_start[iVar17].hi +
             local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
             .super__Vector_impl_data._M_start[iVar17].lo;
        uVar14 = uVar14 + 1;
      } while ((uVar11 & 0x7fffffff) != uVar14);
    }
  }
  else {
    HVectorBase<double>::tight(result);
  }
  if (local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HighsSparseMatrix::priceByRowWithSwitch(
    const bool quad_precision, HVector& result, const HVector& column,
    const double expected_density, const HighsInt from_index,
    const double switch_density, const HighsInt debug_report) const {
  assert(this->isRowwise());
  HighsSparseVectorSum sum;
  // todo @Julian: Setting up the sparse vector sum is equivalent to calling
  // HVector::setup() I think there should instead be overloads where the result
  // vector is of type HVectorQuad for the future and not the boolean parameter
  // quad_precision. Then the buffer can be maintained similar to row_ap.
  if (quad_precision) sum.setDimension(num_col_);
  if (debug_report >= kDebugReportAll)
    printf("\nHighsSparseMatrix::priceByRowWithSwitch\n");
  // (Continue) hyper-sparse row-wise PRICE with possible switches to
  // standard row-wise PRICE either immediately based on historical
  // density or during hyper-sparse PRICE if there is too much fill-in
  HighsInt next_index = from_index;
  // Possibly don't perform hyper-sparse PRICE based on historical density
  //
  // Ensure that result was set up for this number of columns, and
  // that result.index is still of correct size
  assert(HighsInt(result.size) == this->num_col_);
  assert(HighsInt(result.index.size()) == this->num_col_);
  if (expected_density <= kHyperPriceDensity) {
    double inv_num_col = 1.0 / this->num_col_;
    for (HighsInt ix = next_index; ix < column.count; ix++) {
      HighsInt iRow = column.index[ix];
      // Determine whether p_end_ or the next start_ ends the loop
      HighsInt to_iEl;
      if (this->format_ == MatrixFormat::kRowwisePartitioned) {
        to_iEl = this->p_end_[iRow];
      } else {
        to_iEl = this->start_[iRow + 1];
      }
      // Possibly switch to standard row-wise price
      HighsInt row_num_nz = to_iEl - this->start_[iRow];
      double local_density = (1.0 * result.count) * inv_num_col;
      bool switch_to_dense = result.count + row_num_nz >= this->num_col_ ||
                             local_density > switch_density;
      if (switch_to_dense) break;
      double multiplier = column.array[iRow];
      if (debug_report == kDebugReportAll || debug_report == iRow)
        debugReportRowPrice(iRow, multiplier, to_iEl, result.array);
      if (multiplier) {
        if (quad_precision) {
          for (HighsInt iEl = this->start_[iRow]; iEl < to_iEl; iEl++) {
            sum.add(this->index_[iEl], multiplier * this->value_[iEl]);
          }
        } else {
          for (HighsInt iEl = this->start_[iRow]; iEl < to_iEl; iEl++) {
            HighsInt iCol = this->index_[iEl];
            double value0 = result.array[iCol];
            double value1 = value0 + multiplier * this->value_[iEl];
            if (value0 == 0) result.index[result.count++] = iCol;
            result.array[iCol] =
                (fabs(value1) < kHighsTiny) ? kHighsZero : value1;
          }
        }
      }
      next_index = ix + 1;
    }
  }
  if (quad_precision)
    sum.cleanup([](HighsInt, double x) { return std::abs(x) <= kHighsTiny; });
  if (next_index < column.count) {
    // PRICE is not complete: finish without maintaining nonzeros of result
    if (quad_precision) {
      std::vector<HighsCDouble> result_array = sum.values;
      this->priceByRowDenseResult(result_array, column, next_index);
      // Determine indices of nonzeros in result
      result.count = 0;
      for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
        double value1 = (double)result_array[iCol];
        if (fabs(value1) < kHighsTiny) {
          result.array[iCol] = 0;
        } else {
          result.array[iCol] = value1;
          result.index[result.count++] = iCol;
        }
      }
    } else {
      this->priceByRowDenseResult(result.array, column, next_index);
      // Determine indices of nonzeros in result
      result.count = 0;
      for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
        double value1 = result.array[iCol];
        if (fabs(value1) < kHighsTiny) {
          result.array[iCol] = 0;
        } else {
          result.index[result.count++] = iCol;
        }
      }
    }
  } else {
    if (quad_precision) {
      // HVector result should have result.index of size this->num_col_
      // by virtue of result.setup. However, it will generally lose
      // this property by virtue of the following move
      result.index = std::move(sum.nonzeroinds);
      HighsInt result_num_nz = result.index.size();
      // Restore the size of result.index
      result.index.resize(this->num_col_);
      result.count = result_num_nz;
      for (HighsInt i = 0; i < result_num_nz; ++i) {
        HighsInt iRow = result.index[i];
        result.array[iRow] = sum.getValue(iRow);
      }
    } else {
      // PRICE is complete maintaining nonzeros of result
      // Remove small values
      result.tight();
    }
  }
}